

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

XMLError __thiscall
XMLParser::XMLNode::writeToFile(XMLNode *this,char *filename,char *encoding,char nFormat)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *__ptr;
  bool bVar4;
  bool bVar5;
  char *t;
  int i;
  uchar h_1 [3];
  uchar h [3];
  XMLNode local_40;
  FILE *local_38;
  FILE *f;
  char *pcStack_28;
  char nFormat_local;
  char *encoding_local;
  char *filename_local;
  XMLNode *this_local;
  
  if (this->d == (XMLNodeData *)0x0) {
    this_local._4_4_ = eXMLErrorNone;
  }
  else {
    f._7_1_ = nFormat;
    pcStack_28 = encoding;
    encoding_local = filename;
    filename_local = (char *)this;
    local_38 = (FILE *)xfopen(filename,"wb");
    if (local_38 == (FILE *)0x0) {
      this_local._4_4_ = eXMLErrorCannotOpenWriteFile;
    }
    else {
      cVar1 = isDeclaration(this);
      bVar4 = false;
      bVar5 = false;
      if (cVar1 == '\0') {
        bVar4 = this->d->lpszName == (char *)0x0;
        bVar5 = true;
        if (bVar4) {
          getChildNode(&local_40,(int)this);
          cVar1 = isDeclaration(&local_40);
          bVar5 = cVar1 == '\0';
        }
      }
      if (bVar4) {
        ~XMLNode(&local_40);
      }
      if (bVar5) {
        if (characterEncoding == 1) {
          i._1_2_ = 0xbbef;
          i._3_1_ = 0xbf;
          sVar3 = fwrite((void *)((long)&i + 1),3,1,local_38);
          if (sVar3 == 0) {
            fclose(local_38);
            return eXMLErrorCannotWriteFile;
          }
          pcStack_28 = "utf-8";
        }
        else if (characterEncoding == 3) {
          pcStack_28 = "SHIFT-JIS";
        }
        if (pcStack_28 == (char *)0x0) {
          pcStack_28 = "ISO-8859-1";
        }
        iVar2 = fprintf(local_38,"<?xml version=\"1.0\" encoding=\"%s\"?>\n",pcStack_28);
        if (iVar2 < 0) {
          fclose(local_38);
          return eXMLErrorCannotWriteFile;
        }
      }
      else if (characterEncoding == 1) {
        t._6_2_ = 0xbbef;
        i._0_1_ = 0xbf;
        sVar3 = fwrite((void *)((long)&t + 6),3,1,local_38);
        if (sVar3 == 0) {
          fclose(local_38);
          return eXMLErrorCannotWriteFile;
        }
      }
      __ptr = createXMLString(this,(int)f._7_1_,(int *)&t);
      sVar3 = fwrite(__ptr,(long)(int)t,1,local_38);
      if (sVar3 == 0) {
        free(__ptr);
        fclose(local_38);
        this_local._4_4_ = eXMLErrorCannotWriteFile;
      }
      else {
        iVar2 = fclose(local_38);
        if (iVar2 == 0) {
          free(__ptr);
          this_local._4_4_ = eXMLErrorNone;
        }
        else {
          free(__ptr);
          this_local._4_4_ = eXMLErrorCannotWriteFile;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

XMLError XMLNode::writeToFile(XMLCSTR filename, const char * encoding, char nFormat) const
    {
        if(!d)
            return eXMLErrorNone;
        FILE * f = xfopen(filename, _CXML("wb"));
        if(!f)
            return eXMLErrorCannotOpenWriteFile;
#ifdef _XMLWIDECHAR
        unsigned char h[2] = {0xFF, 0xFE};
        if(!fwrite(h, 2, 1, f))
        {
            fclose(f);
            return eXMLErrorCannotWriteFile;
        }
        if((!isDeclaration()) && ((d->lpszName) || (!getChildNode().isDeclaration())))
        {
            if(!fwrite(
                 L"<?xml version=\"1.0\" encoding=\"utf-16\"?>\n", sizeof(wchar_t) * 40, 1, f))
            {
                fclose(f);
                return eXMLErrorCannotWriteFile;
            }
        }
#else
        if((!isDeclaration()) && ((d->lpszName) || (!getChildNode().isDeclaration())))
        {
            if(characterEncoding == char_encoding_UTF8)
            {
                // header so that windows recognize the file as UTF-8:
                unsigned char h[3] = {0xEF, 0xBB, 0xBF};
                if(!fwrite(h, 3, 1, f))
                {
                    fclose(f);
                    return eXMLErrorCannotWriteFile;
                }
                encoding = "utf-8";
            }
            else if(characterEncoding == char_encoding_ShiftJIS)
                encoding = "SHIFT-JIS";

            if(!encoding)
                encoding = "ISO-8859-1";
            if(fprintf(f, "<?xml version=\"1.0\" encoding=\"%s\"?>\n", encoding) < 0)
            {
                fclose(f);
                return eXMLErrorCannotWriteFile;
            }
        }
        else
        {
            if(characterEncoding == char_encoding_UTF8)
            {
                unsigned char h[3] = {0xEF, 0xBB, 0xBF};
                if(!fwrite(h, 3, 1, f))
                {
                    fclose(f);
                    return eXMLErrorCannotWriteFile;
                }
            }
        }
#endif
        int i;
        XMLSTR t = createXMLString(nFormat, &i);
        if(!fwrite(t, sizeof(XMLCHAR) * i, 1, f))
        {
            free(t);
            fclose(f);
            return eXMLErrorCannotWriteFile;
        }
        if(fclose(f) != 0)
        {
            free(t);
            return eXMLErrorCannotWriteFile;
        }
        free(t);
        return eXMLErrorNone;
    }